

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bs2051.cpp
# Opt level: O1

Layout * ear::getLayout(Layout *__return_storage_ptr__,string *name)

{
  pointer pcVar1;
  Layout *pLVar2;
  bool bVar3;
  unknown_layout *this;
  __normal_iterator<const_ear::Layout_*,_std::vector<ear::Layout,_std::allocator<ear::Layout>_>_>
  __it;
  long lVar4;
  __normal_iterator<const_ear::Layout_*,_std::vector<ear::Layout,_std::allocator<ear::Layout>_>_>
  __it_00;
  string *local_40;
  string *local_38;
  
  pLVar2 = DAT_001a39f0;
  lVar4 = ((long)DAT_001a39f0 - (long)BS2051_LAYOUTS >> 4) * 0x6db6db6db6db6db7 >> 2;
  __it_00._M_current = BS2051_LAYOUTS;
  local_40 = name;
  local_38 = name;
  if (0 < lVar4) {
    lVar4 = lVar4 + 1;
    do {
      bVar3 = __gnu_cxx::__ops::_Iter_pred<ear::getLayout(std::__cxx11::string_const&)::$_0>::
              operator()((_Iter_pred<ear::getLayout(std::__cxx11::string_const&)::__0> *)&local_40,
                         __it_00);
      __it._M_current = __it_00._M_current;
      if (bVar3) goto LAB_0012147b;
      bVar3 = __gnu_cxx::__ops::_Iter_pred<ear::getLayout(std::__cxx11::string_const&)::$_0>::
              operator()((_Iter_pred<ear::getLayout(std::__cxx11::string_const&)::__0> *)&local_40,
                         __it_00._M_current + 1);
      __it._M_current = __it_00._M_current + 1;
      if (bVar3) goto LAB_0012147b;
      bVar3 = __gnu_cxx::__ops::_Iter_pred<ear::getLayout(std::__cxx11::string_const&)::$_0>::
              operator()((_Iter_pred<ear::getLayout(std::__cxx11::string_const&)::__0> *)&local_40,
                         __it_00._M_current + 2);
      __it._M_current = __it_00._M_current + 2;
      if (bVar3) goto LAB_0012147b;
      bVar3 = __gnu_cxx::__ops::_Iter_pred<ear::getLayout(std::__cxx11::string_const&)::$_0>::
              operator()((_Iter_pred<ear::getLayout(std::__cxx11::string_const&)::__0> *)&local_40,
                         __it_00._M_current + 3);
      __it._M_current = __it_00._M_current + 3;
      if (bVar3) goto LAB_0012147b;
      __it_00._M_current = __it_00._M_current + 4;
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  lVar4 = ((long)pLVar2 - (long)__it_00._M_current >> 4) * 0x6db6db6db6db6db7;
  if (lVar4 != 1) {
    __it._M_current = __it_00._M_current;
    if (lVar4 != 2) {
      __it._M_current = pLVar2;
      if ((lVar4 != 3) ||
         (bVar3 = __gnu_cxx::__ops::_Iter_pred<ear::getLayout(std::__cxx11::string_const&)::$_0>::
                  operator()((_Iter_pred<ear::getLayout(std::__cxx11::string_const&)::__0> *)
                             &local_40,__it_00), __it._M_current = __it_00._M_current, bVar3))
      goto LAB_0012147b;
      __it._M_current = __it_00._M_current + 1;
    }
    bVar3 = __gnu_cxx::__ops::_Iter_pred<ear::getLayout(std::__cxx11::string_const&)::$_0>::
            operator()((_Iter_pred<ear::getLayout(std::__cxx11::string_const&)::__0> *)&local_40,
                       __it);
    if (bVar3) goto LAB_0012147b;
    __it_00._M_current = __it._M_current + 1;
  }
  bVar3 = __gnu_cxx::__ops::_Iter_pred<ear::getLayout(std::__cxx11::string_const&)::$_0>::operator()
                    ((_Iter_pred<ear::getLayout(std::__cxx11::string_const&)::__0> *)&local_40,
                     __it_00);
  __it._M_current = pLVar2;
  if (bVar3) {
    __it._M_current = __it_00._M_current;
  }
LAB_0012147b:
  if (__it._M_current == DAT_001a39f0) {
    this = (unknown_layout *)__cxa_allocate_exception(0x10);
    unknown_layout::unknown_layout(this,local_38);
    __cxa_throw(this,&unknown_layout::typeinfo,std::invalid_argument::~invalid_argument);
  }
  (__return_storage_ptr__->_name)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->_name).field_2;
  pcVar1 = ((__it._M_current)->_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + ((__it._M_current)->_name)._M_string_length);
  std::vector<ear::Channel,_std::allocator<ear::Channel>_>::vector
            (&__return_storage_ptr__->_channels,&(__it._M_current)->_channels);
  (__return_storage_ptr__->_screen).super_type.m_initialized = false;
  if (((__it._M_current)->_screen).super_type.m_initialized == true) {
    boost::variant<ear::PolarScreen,_ear::CartesianScreen>::variant
              ((variant<ear::PolarScreen,_ear::CartesianScreen> *)
               &(__return_storage_ptr__->_screen).super_type.m_storage,
               (variant<ear::PolarScreen,_ear::CartesianScreen> *)
               &((__it._M_current)->_screen).super_type.m_storage);
    (__return_storage_ptr__->_screen).super_type.m_initialized = true;
  }
  return __return_storage_ptr__;
}

Assistant:

Layout getLayout(const std::string& name) {
    auto& layouts = loadLayouts();
    auto it = std::find_if(
        layouts.begin(), layouts.end(),
        [&name](const Layout& l) -> bool { return l.name() == name; });
    if (it == layouts.end()) {
      throw unknown_layout(name);
    }
    return *it;
  }